

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtppacket.cpp
# Opt level: O0

uint32_t __thiscall jrtplib::RTPPacket::GetCSRC(RTPPacket *this,int num)

{
  uint32_t csrcval_hbo;
  uint32_t *csrcval_nbo;
  uint8_t *csrcpos;
  int num_local;
  RTPPacket *this_local;
  
  if (num < this->numcsrcs) {
    this_local._4_4_ = ntohl(*(uint32_t *)(this->packet + (long)num * 4 + 0xc));
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t RTPPacket::GetCSRC(int num) const
{
	if (num >= numcsrcs)
		return 0;

	uint8_t *csrcpos;
	uint32_t *csrcval_nbo;
	uint32_t csrcval_hbo;
	
	csrcpos = packet+sizeof(RTPHeader)+num*sizeof(uint32_t);
	csrcval_nbo = (uint32_t *)csrcpos;
	csrcval_hbo = ntohl(*csrcval_nbo);
	return csrcval_hbo;
}